

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O0

Adj * Omega_h::find_coarsen_domains
                (Adj *__return_storage_ptr__,Mesh *mesh,LOs *keys2verts,Int ent_dim,
                Read<signed_char> *ents_are_dead)

{
  Write<signed_char> local_2e8;
  Read<signed_char> local_2d8;
  Write<int> local_2c8;
  Read<int> local_2b8;
  Read<int> local_2a8;
  Write<int> local_298;
  Read<int> local_288;
  undefined1 local_278 [8];
  LOs k2lke;
  Read<int> local_258;
  undefined1 local_248 [8];
  Write<int> lke2e;
  Read<int> local_228;
  undefined1 local_218 [8];
  Write<signed_char> lke_codes;
  Read<int> local_1f8;
  undefined1 local_1e8 [8];
  Write<int> lke2k;
  Read<signed_char> local_1c8;
  undefined1 local_1b8 [8];
  LOs lke2ke;
  Read<int> local_198;
  undefined1 local_188 [8];
  Write<signed_char> kes_are_live;
  undefined1 local_168 [8];
  Read<signed_char> ents_are_live;
  undefined1 local_148 [8];
  LOs ke2k;
  Read<signed_char> ke_codes;
  LOs ke2e;
  LOs k2ke;
  Read<int> local_c8;
  undefined1 local_b8 [8];
  Adj k2e;
  Adj v2e;
  LO nkeys;
  Read<signed_char> *ents_are_dead_local;
  Int ent_dim_local;
  LOs *keys2verts_local;
  Mesh *mesh_local;
  ulong local_10;
  
  if (((ulong)(keys2verts->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((keys2verts->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(keys2verts->write_).shared_alloc_.alloc >> 3;
  }
  Mesh::ask_up((Adj *)&k2e.codes.write_.shared_alloc_.direct_ptr,mesh,0,ent_dim);
  Read<int>::Read(&local_c8,keys2verts);
  Adj::Adj((Adj *)&k2ke.write_.shared_alloc_.direct_ptr,
           (Adj *)&k2e.codes.write_.shared_alloc_.direct_ptr);
  unmap_adjacency((Adj *)local_b8,&local_c8,(Adj *)&k2ke.write_.shared_alloc_.direct_ptr);
  Adj::~Adj((Adj *)&k2ke.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_c8);
  Read<int>::Read((Read<int> *)&ke2e.write_.shared_alloc_.direct_ptr,(Read<int> *)local_b8);
  Read<int>::Read((Read<int> *)&ke_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&k2e.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&ke2k.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&k2e.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&ents_are_live.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ke2e.write_.shared_alloc_.direct_ptr);
  invert_fan((Omega_h *)local_148,(LOs *)&ents_are_live.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ents_are_live.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read((Read<signed_char> *)&kes_are_live.shared_alloc_.direct_ptr,ents_are_dead)
  ;
  invert_marks((Omega_h *)local_168,(Read<signed_char> *)&kes_are_live.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&kes_are_live.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_198,(Read<int> *)&ke_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&lke2ke.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_168);
  unmap<signed_char>((Omega_h *)local_188,&local_198,
                     (Read<signed_char> *)&lke2ke.write_.shared_alloc_.direct_ptr,1);
  Read<signed_char>::~Read((Read<signed_char> *)&lke2ke.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_198);
  Write<signed_char>::Write
            ((Write<signed_char> *)&lke2k.shared_alloc_.direct_ptr,(Write<signed_char> *)local_188);
  Read<signed_char>::Read(&local_1c8,(Write<signed_char> *)&lke2k.shared_alloc_.direct_ptr);
  collect_marked((Omega_h *)local_1b8,&local_1c8);
  Read<signed_char>::~Read(&local_1c8);
  Write<signed_char>::~Write((Write<signed_char> *)&lke2k.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_1f8,(Read<int> *)local_1b8);
  Read<int>::Read((Read<int> *)&lke_codes.shared_alloc_.direct_ptr,(Read<int> *)local_148);
  unmap<int>((Omega_h *)local_1e8,&local_1f8,(Read<int> *)&lke_codes.shared_alloc_.direct_ptr,1);
  Read<int>::~Read((Read<int> *)&lke_codes.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_1f8);
  Read<int>::Read(&local_228,(Read<int> *)local_1b8);
  Read<signed_char>::Read
            ((Read<signed_char> *)&lke2e.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&ke2k.write_.shared_alloc_.direct_ptr);
  unmap<signed_char>((Omega_h *)local_218,&local_228,
                     (Read<signed_char> *)&lke2e.shared_alloc_.direct_ptr,1);
  Read<signed_char>::~Read((Read<signed_char> *)&lke2e.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_228);
  Read<int>::Read(&local_258,(Read<int> *)local_1b8);
  Read<int>::Read((Read<int> *)&k2lke.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ke_codes.write_.shared_alloc_.direct_ptr);
  unmap<int>((Omega_h *)local_248,&local_258,(Read<int> *)&k2lke.write_.shared_alloc_.direct_ptr,1);
  Read<int>::~Read((Read<int> *)&k2lke.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_258);
  Write<int>::Write(&local_298,(Write<int> *)local_1e8);
  Read<int>::Read(&local_288,&local_298);
  invert_funnel((Omega_h *)local_278,&local_288,(LO)(local_10 >> 2));
  Read<int>::~Read(&local_288);
  Write<int>::~Write(&local_298);
  Read<int>::Read(&local_2a8,(Read<int> *)local_278);
  Write<int>::Write(&local_2c8,(Write<int> *)local_248);
  Read<int>::Read(&local_2b8,&local_2c8);
  Write<signed_char>::Write(&local_2e8,(Write<signed_char> *)local_218);
  Read<signed_char>::Read(&local_2d8,&local_2e8);
  Adj::Adj(__return_storage_ptr__,&local_2a8,&local_2b8,&local_2d8);
  Read<signed_char>::~Read(&local_2d8);
  Write<signed_char>::~Write(&local_2e8);
  Read<int>::~Read(&local_2b8);
  Write<int>::~Write(&local_2c8);
  Read<int>::~Read(&local_2a8);
  Read<int>::~Read((Read<int> *)local_278);
  Write<int>::~Write((Write<int> *)local_248);
  Write<signed_char>::~Write((Write<signed_char> *)local_218);
  Write<int>::~Write((Write<int> *)local_1e8);
  Read<int>::~Read((Read<int> *)local_1b8);
  Write<signed_char>::~Write((Write<signed_char> *)local_188);
  Read<signed_char>::~Read((Read<signed_char> *)local_168);
  Read<int>::~Read((Read<int> *)local_148);
  Read<signed_char>::~Read((Read<signed_char> *)&ke2k.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ke_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ke2e.write_.shared_alloc_.direct_ptr);
  Adj::~Adj((Adj *)local_b8);
  Adj::~Adj((Adj *)&k2e.codes.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

Adj find_coarsen_domains(
    Mesh* mesh, LOs keys2verts, Int ent_dim, Read<I8> ents_are_dead) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, ent_dim);
  auto k2e = unmap_adjacency(keys2verts, v2e);
  auto k2ke = k2e.a2ab;
  auto ke2e = k2e.ab2b;
  auto ke_codes = k2e.codes;
  auto ke2k = invert_fan(k2ke);
  auto ents_are_live = invert_marks(ents_are_dead);
  auto kes_are_live = unmap(ke2e, ents_are_live, 1);
  auto lke2ke = collect_marked(kes_are_live);
  auto lke2k = unmap(lke2ke, ke2k, 1);
  auto lke_codes = unmap(lke2ke, ke_codes, 1);
  auto lke2e = unmap(lke2ke, ke2e, 1);
  auto k2lke = invert_funnel(lke2k, nkeys);
  return Adj(k2lke, lke2e, lke_codes);
}